

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* re2::RegexpGenerator::EgrepOps_abi_cxx11_(void)

{
  int iVar1;
  allocator_type local_9;
  
  if (EgrepOps[abi:cxx11]()::v_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&EgrepOps[abi:cxx11]()::v_abi_cxx11_);
    if (iVar1 != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const**,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &EgrepOps[abi:cxx11]()::v_abi_cxx11_,EgrepOps::ops,
                 (char **)&FLAGS_max_regexp_failures,&local_9);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,&EgrepOps[abi:cxx11]()::v_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&EgrepOps[abi:cxx11]()::v_abi_cxx11_);
    }
  }
  return &EgrepOps[abi:cxx11]()::v_abi_cxx11_;
}

Assistant:

const vector<string>& RegexpGenerator::EgrepOps() {
  static const char *ops[] = {
    "%s%s",
    "%s|%s",
    "%s*",
    "%s+",
    "%s?",
    "%s\\C*",
  };
  static vector<string> v(ops, ops + arraysize(ops));
  return v;
}